

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Schema.cc
# Opt level: O0

void __thiscall avro::MapSchema::MapSchema(MapSchema *this,Schema *valuesSchema)

{
  type this_00;
  Schema *in_RSI;
  undefined8 *in_RDI;
  Node *in_stack_ffffffffffffffb8;
  Schema *in_stack_ffffffffffffffc0;
  NodeMap *in_stack_ffffffffffffffe0;
  
  operator_new(0x30);
  NodeMap::NodeMap(in_stack_ffffffffffffffe0);
  Schema::Schema(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  *in_RDI = &PTR__MapSchema_00266470;
  this_00 = boost::shared_ptr<avro::Node>::operator->((shared_ptr<avro::Node> *)(in_RDI + 1));
  Schema::root(in_RSI);
  Node::addLeaf(this_00,(NodePtr *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

MapSchema::MapSchema(const Schema &valuesSchema) :
    Schema(new NodeMap)
{
    node_->addLeaf(valuesSchema.root());
}